

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontFamily.cpp
# Opt level: O0

FontFaceHandleDefault * __thiscall
Rml::FontFamily::GetFaceHandle(FontFamily *this,FontStyle style,FontWeight weight,int size)

{
  FontStyle FVar1;
  FontWeight FVar2;
  int iVar3;
  FontFace *pFVar4;
  reference this_00;
  pointer this_01;
  int dist;
  FontFace *face;
  size_t i;
  FontFace *matching_face;
  int best_dist;
  int size_local;
  FontWeight weight_local;
  FontStyle style_local;
  FontFamily *this_local;
  
  matching_face._4_4_ = 0x7fffffff;
  i = 0;
  for (face = (FontFace *)0x0;
      pFVar4 = (FontFace *)
               ::std::
               vector<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
               ::size(&this->font_faces), this_01 = (pointer)i, face < pFVar4;
      face = (FontFace *)&face->field_0x1) {
    this_00 = ::std::
              vector<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
              ::operator[](&this->font_faces,(size_type)face);
    this_01 = ::std::unique_ptr<Rml::FontFace,_std::default_delete<Rml::FontFace>_>::get
                        (&this_00->face);
    FVar1 = FontFace::GetStyle(this_01);
    if (FVar1 == style) {
      FVar2 = FontFace::GetWeight(this_01);
      iVar3 = Math::Absolute((uint)FVar2 - (uint)weight);
      if (iVar3 == 0) break;
      if (iVar3 < matching_face._4_4_) {
        i = (size_t)this_01;
        matching_face._4_4_ = iVar3;
      }
    }
  }
  i = (size_t)this_01;
  if (i == 0) {
    this_local = (FontFamily *)0x0;
  }
  else {
    this_local = (FontFamily *)FontFace::GetHandle((FontFace *)i,size,true);
  }
  return (FontFaceHandleDefault *)this_local;
}

Assistant:

FontFaceHandleDefault* FontFamily::GetFaceHandle(Style::FontStyle style, Style::FontWeight weight, int size)
{
	int best_dist = INT_MAX;
	FontFace* matching_face = nullptr;
	for (size_t i = 0; i < font_faces.size(); i++)
	{
		FontFace* face = font_faces[i].face.get();

		if (face->GetStyle() == style)
		{
			const int dist = Math::Absolute((int)face->GetWeight() - (int)weight);
			if (dist == 0)
			{
				// Direct match for weight, break the loop early.
				matching_face = face;
				break;
			}
			else if (dist < best_dist)
			{
				// Best match so far for weight, store the face and dist.
				matching_face = face;
				best_dist = dist;
			}
		}
	}

	if (!matching_face)
		return nullptr;

	return matching_face->GetHandle(size, true);
}